

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O2

void TTD::NSSnapType::ParseSnapHandler
               (SnapHandler *snapHandler,bool readSeparator,FileReader *reader,SlabAllocator *alloc)

{
  SnapEntryDataKindTag SVar1;
  SnapAttributeTag SVar2;
  uint32 uVar3;
  TTD_PTR_ID TVar4;
  SnapHandlerPropertyEntry *pSVar5;
  undefined7 in_register_00000031;
  uint32 i;
  ulong uVar6;
  
  (*reader->_vptr_FileReader[6])(reader,CONCAT71(in_register_00000031,readSeparator));
  TVar4 = FileReader::ReadAddr(reader,handlerId,false);
  snapHandler->HandlerId = TVar4;
  uVar3 = FileReader::ReadUInt32(reader,extensibleFlag,true);
  snapHandler->IsExtensibleFlag = (byte)uVar3;
  uVar3 = FileReader::ReadUInt32(reader,inlineSlotCapacity,true);
  snapHandler->InlineSlotCapacity = uVar3;
  uVar3 = FileReader::ReadUInt32(reader,totalSlotCapacity,true);
  snapHandler->TotalSlotCapacity = uVar3;
  uVar3 = FileReader::ReadLengthValue(reader,true);
  snapHandler->MaxPropertyIndex = uVar3;
  if (uVar3 == 0) {
    snapHandler->PropertyInfoArray = (SnapHandlerPropertyEntry *)0x0;
  }
  else {
    pSVar5 = SlabAllocatorBase<0>::SlabAllocateArray<TTD::NSSnapType::SnapHandlerPropertyEntry>
                       (alloc,(ulong)uVar3);
    snapHandler->PropertyInfoArray = pSVar5;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    for (uVar6 = 0; uVar6 < snapHandler->MaxPropertyIndex; uVar6 = uVar6 + 1) {
      (*reader->_vptr_FileReader[6])(reader,(ulong)(uVar6 != 0));
      uVar3 = FileReader::ReadUInt32(reader,propertyId,false);
      snapHandler->PropertyInfoArray[uVar6].PropertyRecordId = uVar3;
      SVar1 = FileReader::ReadTag<TTD::NSSnapType::SnapEntryDataKindTag>(reader,dataKindTag,true);
      snapHandler->PropertyInfoArray[uVar6].DataKind = SVar1;
      SVar2 = FileReader::ReadTag<TTD::NSSnapType::SnapAttributeTag>(reader,attributeTag,true);
      snapHandler->PropertyInfoArray[uVar6].AttributeInfo = SVar2;
      (*reader->_vptr_FileReader[7])(reader);
    }
    (*reader->_vptr_FileReader[5])(reader);
  }
  (*reader->_vptr_FileReader[7])(reader);
  return;
}

Assistant:

void ParseSnapHandler(SnapHandler* snapHandler, bool readSeparator, FileReader* reader, SlabAllocator& alloc)
        {
            reader->ReadRecordStart(readSeparator);

            snapHandler->HandlerId = reader->ReadAddr(NSTokens::Key::handlerId);

            snapHandler->IsExtensibleFlag = (byte)reader->ReadUInt32(NSTokens::Key::extensibleFlag, true);

            snapHandler->InlineSlotCapacity = reader->ReadUInt32(NSTokens::Key::inlineSlotCapacity, true);
            snapHandler->TotalSlotCapacity = reader->ReadUInt32(NSTokens::Key::totalSlotCapacity, true);

            snapHandler->MaxPropertyIndex = reader->ReadLengthValue(true);

            if(snapHandler->MaxPropertyIndex == 0)
            {
                snapHandler->PropertyInfoArray = nullptr;
            }
            else
            {
                snapHandler->PropertyInfoArray = alloc.SlabAllocateArray<SnapHandlerPropertyEntry>(snapHandler->MaxPropertyIndex);

                reader->ReadSequenceStart_WDefaultKey(true);
                for(uint32 i = 0; i < snapHandler->MaxPropertyIndex; ++i)
                {
                    reader->ReadRecordStart(i != 0);

                    snapHandler->PropertyInfoArray[i].PropertyRecordId = reader->ReadUInt32(NSTokens::Key::propertyId);
                    snapHandler->PropertyInfoArray[i].DataKind = reader->ReadTag<SnapEntryDataKindTag>(NSTokens::Key::dataKindTag, true);
                    snapHandler->PropertyInfoArray[i].AttributeInfo = reader->ReadTag<SnapAttributeTag>(NSTokens::Key::attributeTag, true);

                    reader->ReadRecordEnd();
                }
                reader->ReadSequenceEnd();
            }

            reader->ReadRecordEnd();
        }